

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

void smtp_state(Curl_easy *data,smtpstate newstate)

{
  smtpstate sVar1;
  connectdata *pcVar2;
  curl_trc_feat *pcVar3;
  
  pcVar2 = data->conn;
  sVar1 = (pcVar2->proto).smtpc.state;
  if ((((data != (Curl_easy *)0x0 && sVar1 != newstate) && (((data->set).field_0x89f & 0x40) != 0))
      && ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
     && (0 < Curl_trc_feat_smtp.log_level)) {
    Curl_trc_smtp(data,"state change from %s to %s",smtp_state::names[sVar1],
                  smtp_state::names[newstate]);
  }
  (pcVar2->proto).smtpc.state = newstate;
  return;
}

Assistant:

static void smtp_state(struct Curl_easy *data, smtpstate newstate)
{
  struct smtp_conn *smtpc = &data->conn->proto.smtpc;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
  /* for debug purposes */
  static const char * const names[] = {
    "STOP",
    "SERVERGREET",
    "EHLO",
    "HELO",
    "STARTTLS",
    "UPGRADETLS",
    "AUTH",
    "COMMAND",
    "MAIL",
    "RCPT",
    "DATA",
    "POSTDATA",
    "QUIT",
    /* LAST */
  };

  if(smtpc->state != newstate)
    CURL_TRC_SMTP(data, "state change from %s to %s",
                  names[smtpc->state], names[newstate]);
#endif

  smtpc->state = newstate;
}